

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YP_md_set_parameter_array(YPSpur *spur,int param_id,double *value)

{
  int iVar1;
  undefined1 local_60 [8];
  YPSpur_msg msg;
  double *value_local;
  int param_id_local;
  YPSpur *spur_local;
  
  local_60 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x100;
  msg._16_8_ = *value;
  msg.data[0] = value[1];
  msg.pid._4_4_ = param_id;
  msg.data[3] = (double)value;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_60);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YP_md_set_parameter_array(YPSpur* spur, int param_id, double* value)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_PARAM_SET;
  msg.cs = param_id;
  msg.data[0] = value[0];
  msg.data[1] = value[1];

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}